

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O2

void OnSetTriggerCtx(ecs_iter_t *it)

{
  uint count;
  EcsTrigger *ct;
  undefined8 *puVar1;
  long lVar2;
  ulong uVar3;
  
  ct = (EcsTrigger *)ecs_column_w_size(it,0x28,1);
  puVar1 = (undefined8 *)ecs_column_w_size(it,8,2);
  count = it->count;
  lVar2 = 0;
  uVar3 = 0;
  if (0 < (int)count) {
    uVar3 = (ulong)count;
  }
  for (; uVar3 * 5 != lVar2; lVar2 = lVar2 + 5) {
    (&ct->ctx)[lVar2] = (void *)*puVar1;
    puVar1 = puVar1 + 1;
  }
  trigger_set(it->world,it->entities,ct,count);
  return;
}

Assistant:

static
void OnSetTriggerCtx(
    ecs_iter_t *it)
{
    EcsTrigger *ct = ecs_column(it, EcsTrigger, 1);
    EcsContext *ctx = ecs_column(it, EcsContext, 2);

    int32_t i;
    for (i = 0; i < it->count; i ++) {
        ct[i].ctx = (void*)ctx[i].ctx;
    }

    trigger_set(it->world, it->entities, ct, it->count);    
}